

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseFieldList
          (WastParser *this,vector<wabt::Field,_std::allocator<wabt::Field>_> *fields)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TokenType TVar2;
  Result RVar3;
  Field field;
  Field local_60;
  
  paVar1 = &local_60.name.field_2;
  do {
    TVar2 = Peek(this,0);
    if ((TVar2 != First_Type) && (TVar2 = Peek(this,0), TVar2 != Lpar)) {
      return (Result)Ok;
    }
    local_60.name._M_string_length = 0;
    local_60.name.field_2._M_local_buf[0] = '\0';
    local_60.type.enum_ = Void;
    local_60.type.type_index_ = 0;
    local_60.mutable_ = false;
    local_60.name._M_dataplus._M_p = (pointer)paVar1;
    RVar3 = ParseField(this,&local_60);
    if (RVar3.enum_ != Error) {
      std::vector<wabt::Field,_std::allocator<wabt::Field>_>::push_back(fields,&local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.name._M_dataplus._M_p,
                      CONCAT71(local_60.name.field_2._M_allocated_capacity._1_7_,
                               local_60.name.field_2._M_local_buf[0]) + 1);
    }
  } while (RVar3.enum_ != Error);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseFieldList(std::vector<Field>* fields) {
  WABT_TRACE(ParseFieldList);
  while (PeekMatch(TokenType::ValueType) || PeekMatch(TokenType::Lpar)) {
    Field field;
    CHECK_RESULT(ParseField(&field));
    fields->push_back(field);
  }
  return Result::Ok;
}